

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1d0ce::TestPassingTestHasNoFailures::RunImpl(TestPassingTestHasNoFailures *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_a8;
  int local_84 [5];
  Test local_70;
  undefined1 local_38 [8];
  ScopedCurrentTest scopedResults;
  TestResults results;
  TestPassingTestHasNoFailures *this_local;
  
  UnitTest::TestResults::TestResults
            ((TestResults *)&scopedResults.m_oldTestDetails,(TestReporter *)0x0);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_38,(TestResults *)&scopedResults.m_oldTestDetails,
             (TestDetails *)0x0);
  RunImpl::PassingTest::PassingTest((PassingTest *)&local_70);
  UnitTest::Test::Run(&local_70);
  RunImpl::PassingTest::~PassingTest((PassingTest *)&local_70);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_38);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_84[1] = 0;
  local_84[0] = UnitTest::TestResults::GetFailureCount
                          ((TestResults *)&scopedResults.m_oldTestDetails);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_a8,*ppTVar2,0x1c);
  UnitTest::CheckEqual<int,int>(results_00,local_84 + 1,local_84,&local_a8);
  return;
}

Assistant:

TEST(PassingTestHasNoFailures)
{
    class PassingTest : public Test
    {
    public:
        PassingTest() : Test("passing") {}
        virtual void RunImpl() const
        {
            CHECK(true);
        }
    };

    TestResults results;
	{
		ScopedCurrentTest scopedResults(results);
		PassingTest().Run();
	}

    CHECK_EQUAL(0, results.GetFailureCount());
}